

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O3

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  iVar3 = container1->cardinality;
  iVar5 = run_container_cardinality(container2);
  uVar6 = 0;
  if (iVar3 <= iVar5) {
    uVar4 = container1->cardinality;
    if (0 < (int)uVar4) {
      uVar7 = 0;
      uVar8 = 0;
      do {
        uVar6 = (uint)uVar7;
        if (container2->n_runs <= (int)uVar8) break;
        uVar1 = container2->runs[uVar8].value;
        uVar2 = container1->array[uVar7];
        if (uVar2 < uVar1) {
          uVar6 = 0;
          goto LAB_0011f2fd;
        }
        uVar9 = (uint)container2->runs[uVar8].length + (uint)uVar1;
        uVar8 = uVar8 + (uVar9 < uVar2);
        uVar6 = (uVar6 + 1) - (uint)(uVar9 < uVar2);
        uVar7 = (ulong)uVar6;
      } while ((int)uVar6 < (int)uVar4);
    }
    uVar6 = (uint)(uVar6 == uVar4);
  }
LAB_0011f2fd:
  return SUB41(uVar6,0);
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}